

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

stref idx2::GetExtension(stref *Path)

{
  char *pcVar1;
  int iVar2;
  stref sVar3;
  char local_9;
  
  local_9 = '.';
  pcVar1 = FindLast<char*,char>
                     ((Path->field_0).Ptr + (long)Path->Size + -1,(Path->field_0).Ptr + -1,&local_9)
  ;
  if (pcVar1 == (Path->field_0).Ptr + -1) {
    sVar3 = (stref)ZEXT816(0);
  }
  else {
    iVar2 = (int)(Path->field_0).Ptr;
    sVar3 = SubString(Path,((uint)pcVar1 - iVar2) + 1,~(uint)pcVar1 + iVar2 + Path->Size);
  }
  return sVar3;
}

Assistant:

stref
GetExtension(const stref& Path)
{
  cstr LastDot = FindLast(RevBegin(Path), RevEnd(Path), '.');
  if (LastDot == RevEnd(Path))
    return stref();

  return SubString(Path, int(LastDot + 1 - Begin(Path)), int(End(Path) - 1 - LastDot));
}